

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.hpp
# Opt level: O2

bool __thiscall
BSTree<const_int_&,_int>::BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode>::insert
          (BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode> *this,int *key,int val)

{
  int iVar1;
  int iVar2;
  _Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false> _Var3;
  __uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
  __p;
  _Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false> _Var4;
  __uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
  local_18;
  
  _Var3._M_head_impl =
       (this->root)._M_t.
       super___uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
       ._M_t.
       super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
       .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (BSTreeNode *)0x0) {
    iVar1 = *key;
LAB_001014b1:
    do {
      _Var4._M_head_impl = _Var3._M_head_impl;
      iVar2 = *(_Var4._M_head_impl)->key;
      do {
        if (iVar1 == iVar2) {
          return false;
        }
        if (iVar1 < iVar2) {
          _Var3._M_head_impl =
               (BSTreeNode *)
               *(_Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false> *)
                &(_Var4._M_head_impl)->left;
          if (((BSTreeNode *)
              *(_Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false> *)
               &(_Var4._M_head_impl)->left)._M_head_impl != (BSTreeNode *)0x0) goto LAB_001014b1;
          this = (BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode> *)&(_Var4._M_head_impl)->left
          ;
          goto LAB_001014e2;
        }
      } while (iVar1 <= iVar2);
      _Var3._M_head_impl =
           *(BSTreeNode **)
            &((_Var4._M_head_impl)->right)._M_t.
             super___uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
             ._M_t;
    } while ((_Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
              )_Var3._M_head_impl != (BSTreeNode *)0x0);
    this = (BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode> *)&(_Var4._M_head_impl)->right;
  }
LAB_001014e2:
  std::make_unique<BSTree<int_const&,int>::BSTreeNode,int_const&,int&>((int *)&local_18,key);
  __p._M_t.
  super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
  .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
       .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
  .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl =
       (tuple<BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
        )(_Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
          )0x0;
  std::
  __uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
  ::reset((__uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
           *)this,(pointer)__p._M_t.
                           super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                           .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>.
                           _M_head_impl);
  std::
  unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
  ::~unique_ptr((unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                 *)&local_18);
  return true;
}

Assistant:

bool insert(Key key, Val val){
      // if tree is not empty ...
      if (root){
        // we perform a traversal until we reach an empty subtree
        Node* currentNode = root.get();
        while (currentNode){
          // if key is present, no insertion is made
          if (key == currentNode->key){
            return false;
          }
          // otherwise we go down
          else{
            if (key < currentNode->key){
              // either we recursively insert into a nonempty subtree
              // ...
              if (currentNode->left){
                currentNode = currentNode->left.get();
              }
              // ... or we perform insertion in an empty subtree
              else{
                currentNode->left = std::make_unique<Node>(key, val);
                return true;
              }
            }
            // the same goes for right descent
            else if (key > currentNode->key){
              if (currentNode->right){
                currentNode = currentNode->right.get();
              }
              else{
                currentNode->right = std::make_unique<Node>(key, val);
                return true;
              }
            }
          }
        }
      }
      // if tree is empty, we insert at root
      else{
        root = std::make_unique<Node>(key, val);
        return true;
      }
      // this line should not be reached
      return true;
    }